

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O1

void __thiscall Timidity::Renderer::note_on(Renderer *this,int chan,int note,int vel)

{
  Voice *pVVar1;
  long lVar2;
  int *piVar3;
  int i;
  long lVar4;
  
  if (vel != 0) {
    i = this->voices;
    lVar4 = (long)i;
    if (lVar4 != 0) {
      piVar3 = &this->channel[(uint)chan].mono;
      lVar2 = lVar4 * 0x170;
      do {
        i = i + -1;
        pVVar1 = this->voice;
        if (((uint)(&pVVar1[-1].channel)[lVar2] == chan) &&
           ((((uint)(&pVVar1[-1].note)[lVar2] == note &&
             (*(char *)(*(long *)((long)&pVVar1[-1].sample + lVar2) + 0x50) != '\x01')) ||
            (*piVar3 != 0)))) {
          if (*piVar3 == 0) {
            finish_note(this,i);
          }
          else if (((&pVVar1[-1].status)[lVar2] & 1) != 0) {
            (&pVVar1[-1].status)[lVar2] = (&pVVar1[-1].status)[lVar2] & 0xf1 | 0xc;
          }
        }
        lVar4 = lVar4 + -1;
        lVar2 = lVar2 + -0x170;
      } while (lVar4 != 0);
    }
    start_note(this,chan,note,vel);
    return;
  }
  note_off(this,chan,note,0);
  return;
}

Assistant:

void Renderer::note_on(int chan, int note, int vel)
{
	if (vel == 0)
	{
		note_off(chan, note, 0);
		return;
	}

	int i = voices;

	/* Only one instance of a note can be playing on a single channel. */
	while (i--)
	{
		if (voice[i].channel == chan && ((voice[i].note == note && !voice[i].sample->self_nonexclusive) || channel[chan].mono))
		{
			if (channel[chan].mono)
			{
				kill_note(i);
			}
			else
			{
				finish_note(i);
			}
		}
	}

	start_note(chan, note, vel);
}